

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QStringList * __thiscall
QLocale::uiLanguages(QStringList *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  QLocaleData *pQVar6;
  QLocaleData *pQVar7;
  ushort uVar8;
  ushort uVar9;
  Data *pDVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  QLocaleId QVar15;
  QSystemLocale *pQVar16;
  QLocalePrivate *pQVar17;
  char *pcVar18;
  storage_type_conflict *psVar19;
  qsizetype qVar20;
  QLocaleId *pQVar21;
  QString *pQVar22;
  uint uVar23;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_01;
  PrivateShared *pPVar24;
  storage_type_conflict *extraout_RDX_02;
  storage_type_conflict *extraout_RDX_03;
  storage_type_conflict *extraout_RDX_04;
  add_const_t<QList<QString>_> *__range2;
  const_iterator cVar25;
  QChar c;
  QLocaleId QVar26;
  QChar before;
  QArrayDataPointer<QString> *this_00;
  long lVar27;
  ushort uVar28;
  storage_type_conflict *psVar29;
  ushort uVar30;
  QString *entry;
  long lVar31;
  storage_type_conflict *psVar32;
  storage_type_conflict *psVar33;
  const_iterator __it;
  char *__filename;
  long in_FS_OFFSET;
  QStringView before_00;
  QStringView name;
  QLatin1StringView str;
  QStringView name_00;
  QStringView name_01;
  QStringView name_02;
  QStringView name_03;
  QStringView s;
  QStringView stem;
  QStringView stem_00;
  QStringView after;
  storage_type_conflict *local_818;
  storage_type_conflict *local_808;
  long local_7f0;
  long local_7e0;
  long local_7d8;
  storage_type_conflict *local_7c8;
  long local_7c0;
  QLocaleId local_7b0;
  QArrayDataPointer<char> local_7a8;
  QLocaleId id;
  undefined2 uStack_782;
  QString *pQStack_780;
  QLocaleId *local_778;
  QArrayDataPointer<char16_t> local_770;
  QArrayDataPointer<QString> local_758;
  undefined1 local_739;
  QArrayDataPointer<QString> local_738;
  QArrayDataPointer<QLocaleId> local_718;
  QStringView local_6f8;
  QDuplicateTracker<QString,_32UL> known;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if ((char)separator < '\0') {
    badSeparatorWarning("uiLanguages",separator);
    goto LAB_002e2c95;
  }
  local_718.size = 0;
  local_718.d = (Data *)0x0;
  local_718.ptr = (QLocaleId *)0x0;
  pQVar6 = ((this->d).d.ptr)->m_data;
  if (pQVar6 == &systemLocaleData) {
    pQVar16 = systemLocale();
    local_58._16_8_ = (QLocaleId *)0x0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (QString *)0x0;
    local_40 = 2;
    (*pQVar16->_vptr_QSystemLocale[2])(&known,pQVar16,0x22);
    ::QVariant::toStringList((QStringList *)&local_738,(QVariant *)&known);
    QArrayDataPointer<QString>::operator=(&__return_storage_ptr__->d,&local_738);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_738);
    ::QVariant::~QVariant((QVariant *)&known);
    ::QVariant::~QVariant((QVariant *)&local_58);
    uVar11 = known.buffer._0_8_;
    psVar33 = extraout_RDX;
    if (separator != Dash) {
      known.buffer[1] = '\0';
      known.buffer[0] = separator;
      known.buffer._2_6_ = SUB86(uVar11,2);
      before_00.m_data = L"-";
      before_00.m_size = 1;
      after.m_data = (storage_type_conflict *)&known;
      after.m_size = 1;
      QtPrivate::QStringList_replaceInStrings(__return_storage_ptr__,before_00,after,CaseSensitive);
      QArrayDataPointer<QString>::operator=(&__return_storage_ptr__->d,&__return_storage_ptr__->d);
      psVar33 = extraout_RDX_00;
    }
    pQVar22 = (__return_storage_ptr__->d).ptr;
    for (lVar31 = (__return_storage_ptr__->d).size * 0x18; lVar31 != 0; lVar31 = lVar31 + -0x18) {
      name.m_data = psVar33;
      name.m_size = (qsizetype)(pQVar22->d).ptr;
      QVar15 = QLocaleId::fromName((QLocaleId *)(pQVar22->d).size,name);
      known.buffer._0_6_ = QVar15;
      QList<QLocaleId>::emplaceBack<QLocaleId>((QList<QLocaleId> *)&local_718,(QLocaleId *)&known);
      pQVar22 = pQVar22 + 1;
      psVar33 = extraout_RDX_01;
    }
    if ((PrivateShared *)local_718.size == (PrivateShared *)0x0) {
      pQVar16 = systemLocale();
      (*pQVar16->_vptr_QSystemLocale[3])(&known,pQVar16);
      pQVar17 = QSharedDataPointer<QLocalePrivate>::operator->
                          ((QSharedDataPointer<QLocalePrivate> *)&known);
      pQVar7 = pQVar17->m_data;
      iVar2._0_2_ = pQVar7->m_script_id;
      iVar2._2_2_ = pQVar7->m_territory_id;
      local_58._4_2_ = iVar2._2_2_;
      local_58._0_4_ = iVar2 << 0x10 | (uint)pQVar7->m_language_id;
      QList<QLocaleId>::emplaceBack<QLocaleId>
                ((QList<QLocaleId> *)&local_718,(QLocaleId *)&local_58);
      ~QLocale((QLocale *)&known);
    }
    known.buffer._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    known.buffer._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    known.buffer._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = ((this->d).d.ptr)->m_data;
    iVar3._0_2_ = pQVar7->m_script_id;
    iVar3._2_2_ = pQVar7->m_territory_id;
    local_738.d = (Data *)CONCAT44(CONCAT22(local_738.d._6_2_,iVar3._2_2_),
                                   iVar3 << 0x10 | (uint)pQVar7->m_language_id);
    QLocaleId::name((QByteArray *)&local_58,(QLocaleId *)&local_738,separator);
    QString::fromLatin1<void>((QString *)&known,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    if (((known.buffer._16_8_ != 0) && (((this->d).d.ptr)->m_data->m_language_id != 1)) &&
       (bVar12 = QListSpecialMethods<QString>::contains
                           ((QListSpecialMethods<QString> *)__return_storage_ptr__,(QString *)&known
                            ,CaseSensitive), !bVar12)) {
      pQVar7 = ((this->d).d.ptr)->m_data;
      iVar4._0_2_ = pQVar7->m_script_id;
      iVar4._2_2_ = pQVar7->m_territory_id;
      _id = (PrivateShared *)
            CONCAT44(CONCAT22((short)((ulong)_id >> 0x30),iVar4._2_2_),
                     iVar4 << 0x10 | (uint)pQVar7->m_language_id);
      QVar15 = QLocaleId::withLikelySubtagsRemoved(&id);
      __it.i = (__return_storage_ptr__->d).ptr;
      lVar31 = (__return_storage_ptr__->d).size;
      lVar27 = lVar31 * 0x18;
      pQVar22 = __it.i + lVar31;
      local_58._0_6_ = QVar15;
      for (lVar31 = lVar31 >> 2; cVar25.i = __it.i, 0 < lVar31; lVar31 = lVar31 + -1) {
        bVar12 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it);
        if (bVar12) goto LAB_002e20a0;
        bVar12 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it.i + 1);
        cVar25.i = __it.i + 1;
        if (bVar12) goto LAB_002e20a0;
        bVar12 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it.i + 2);
        cVar25.i = __it.i + 2;
        if (bVar12) goto LAB_002e20a0;
        bVar12 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it.i + 3);
        cVar25.i = __it.i + 3;
        if (bVar12) goto LAB_002e20a0;
        __it.i = __it.i + 4;
        lVar27 = lVar27 + -0x60;
      }
      lVar27 = lVar27 / 0x18;
      if (lVar27 == 1) {
LAB_002e2cc5:
        bVar12 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it);
        cVar25.i = __it.i;
        if (!bVar12) {
          cVar25.i = pQVar22;
        }
LAB_002e20a0:
        if (cVar25.i != pQVar22) goto LAB_002e2112;
      }
      else {
        if (lVar27 == 2) {
LAB_002e2081:
          bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,cVar25);
          if (!bVar12) {
            __it.i = cVar25.i + 1;
            goto LAB_002e2cc5;
          }
          goto LAB_002e20a0;
        }
        if (lVar27 == 3) {
          bVar12 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              local_58.data,__it);
          if (!bVar12) {
            cVar25.i = __it.i + 1;
            goto LAB_002e2081;
          }
          goto LAB_002e20a0;
        }
      }
      QList<QLocaleId>::emplaceFront<QLocaleId_const&>((QList<QLocaleId> *)&local_718,&id);
      QLocaleId::name((QByteArray *)&local_738,&id,separator);
      QString::fromLatin1<void>((QString *)&local_58,(QByteArray *)&local_738);
      QList<QString>::emplaceFront<QString>(__return_storage_ptr__,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_738);
    }
LAB_002e2112:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&known);
  }
  else {
    iVar1._0_2_ = pQVar6->m_script_id;
    iVar1._2_2_ = pQVar6->m_territory_id;
    uVar23 = iVar1 << 0x10 | (uint)pQVar6->m_language_id;
    known.buffer[4] = (char)iVar1._2_2_;
    known.buffer[5] = (char)((ushort)iVar1._2_2_ >> 8);
    known.buffer[0] = (char)uVar23;
    known.buffer[1] = (char)(uVar23 >> 8);
    known.buffer[2] = (char)(uVar23 >> 0x10);
    known.buffer[3] = (char)(uVar23 >> 0x18);
    QList<QLocaleId>::emplaceBack<QLocaleId>((QList<QLocaleId> *)&local_718,(QLocaleId *)&known);
  }
  pPVar24 = (PrivateShared *)local_718.size;
  lVar27 = local_718.size * 6;
  lVar31 = local_718.size * 0x18;
  while( true ) {
    local_7f0 = lVar31 + -0x18;
    if ((long)pPVar24 < 1) break;
    uVar5 = *(undefined4 *)((long)&local_718.ptr[-1].language_id + lVar27);
    id = (QLocaleId)CONCAT24(*(ushort *)((long)&local_718.ptr[-1].territory_id + lVar27),uVar5);
    if ((short)uVar5 == 1) {
      Qt::Literals::StringLiterals::operator____s((QString *)&known,L"C",1);
      bVar12 = QListSpecialMethods<QString>::contains
                         ((QListSpecialMethods<QString> *)__return_storage_ptr__,(QString *)&known,
                          CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&known);
      if (!bVar12) {
        Qt::Literals::StringLiterals::operator____s((QString *)&known,L"C",1);
        QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&known);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&known);
      }
    }
    else {
      local_738.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QLocaleId::name((QByteArray *)&local_58,&id,separator);
      if ((pQVar6 == &systemLocaleData) &&
         (pPVar24 <= (PrivateShared *)(__return_storage_ptr__->d).size)) {
        known.buffer[0] = local_58.data[0x10];
        known.buffer[1] = local_58.data[0x11];
        known.buffer[2] = local_58.data[0x12];
        known.buffer[3] = local_58.data[0x13];
        known.buffer[4] = local_58.data[0x14];
        known.buffer[5] = local_58.data[0x15];
        known.buffer[6] = local_58.data[0x16];
        known.buffer[7] = local_58.data[0x17];
        known.buffer[8] = local_58.data[8];
        known.buffer[9] = local_58.data[9];
        known.buffer[10] = local_58.data[10];
        known.buffer[0xb] = local_58.data[0xb];
        known.buffer[0xc] = local_58.data[0xc];
        known.buffer[0xd] = local_58.data[0xd];
        known.buffer[0xe] = local_58.data[0xe];
        known.buffer[0xf] = local_58.data[0xf];
        bVar12 = ::operator==((QString *)((long)&(__return_storage_ptr__->d).ptr[-1].d.d + lVar31),
                              (QLatin1StringView *)&known);
        local_738.d = (Data *)pPVar24;
      }
      else {
        str.m_data = (char *)local_58._8_8_;
        str.m_size = local_58._16_8_;
        bVar12 = QListSpecialMethods<QString>::contains
                           ((QListSpecialMethods<QString> *)__return_storage_ptr__,str,CaseSensitive
                           );
        if (!bVar12) {
          QString::fromLatin1<void>((QString *)&known,(QByteArray *)&local_58);
          QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&known);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&known);
        }
        bVar12 = true;
        local_738.d = (Data *)(__return_storage_ptr__->d).size;
      }
      QVar15 = QLocaleId::withLikelySubtagsAdded(&id);
      known.buffer._0_8_ = &local_738;
      uVar30 = QVar15.script_id;
      uVar28 = QVar15.territory_id;
      known.buffer[0x16] = separator;
      known.buffer._16_6_ = QVar15;
      known.buffer[0x17] = -0x56;
      known.buffer._24_8_ = local_58.shared;
      known.buffer[0x20] = local_58.data[8];
      known.buffer[0x21] = local_58.data[9];
      known.buffer[0x22] = local_58.data[10];
      known.buffer[0x23] = local_58.data[0xb];
      known.buffer[0x24] = local_58.data[0xc];
      known.buffer[0x25] = local_58.data[0xd];
      known.buffer[0x26] = local_58.data[0xe];
      known.buffer[0x27] = local_58.data[0xf];
      known.buffer[0x28] = local_58.data[0x10];
      known.buffer[0x29] = local_58.data[0x11];
      known.buffer[0x2a] = local_58.data[0x12];
      known.buffer[0x2b] = local_58.data[0x13];
      known.buffer[0x2c] = local_58.data[0x14];
      known.buffer[0x2d] = local_58.data[0x15];
      known.buffer[0x2e] = local_58.data[0x16];
      known.buffer[0x2f] = local_58.data[0x17];
      if (local_58.shared != (PrivateShared *)0x0) {
        LOCK();
        (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      known.buffer[0x31] = -0x56;
      known.buffer[0x32] = -0x56;
      known.buffer[0x33] = -0x56;
      known.buffer[0x34] = -0x56;
      known.buffer[0x35] = -0x56;
      known.buffer[0x36] = -0x56;
      known.buffer[0x37] = -0x56;
      known.buffer[0x30] = bVar12;
      known.buffer._8_8_ = __return_storage_ptr__;
      uiLanguages::anon_class_56_6_d83b7451::operator()
                ((anon_class_56_6_d83b7451 *)&known,(QLocaleId)((uint6)QVar15 & 0xffff));
      if (uVar30 != 0) {
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)&known,(QLocaleId)((uint6)QVar15 & 0xffffffff));
      }
      uVar8 = id.script_id;
      if (id.script_id != uVar30 && id.script_id != 0) {
        QVar26.territory_id = 0;
        QVar26.language_id = (short)(uint)_id;
        QVar26.script_id = (short)((uint)_id >> 0x10);
        uiLanguages::anon_class_56_6_d83b7451::operator()((anon_class_56_6_d83b7451 *)&known,QVar26)
        ;
      }
      if (uVar28 != 0) {
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)&known,(QLocaleId)((uint6)QVar15 & 0xffff0000ffff));
      }
      uVar9 = id.territory_id;
      if (id.territory_id != uVar28 && id.territory_id != 0) {
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)&known,
                   (QLocaleId)((uint6)id.territory_id << 0x20 | (uint6)id.language_id));
      }
      if (uVar30 != 0 && uVar28 != 0) {
        uiLanguages::anon_class_56_6_d83b7451::operator()((anon_class_56_6_d83b7451 *)&known,QVar15)
        ;
      }
      if ((uVar8 != 0 && uVar28 != 0) && uVar8 != uVar30) {
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)&known,
                   (QLocaleId)
                   ((uint6)uVar8 << 0x10 | (uint6)QVar15 & 0xffff00000000 | (uint6)id.language_id));
      }
      if ((uVar9 == 0 || uVar30 == 0) || uVar9 == uVar28) {
        if (uVar9 != 0) goto LAB_002e24d7;
      }
      else {
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)&known,
                   (QLocaleId)
                   (CONCAT24(uVar9,QVar15._0_4_) & 0xffffffff0000 | (uint6)id.language_id));
LAB_002e24d7:
        if ((uVar8 != uVar30 && uVar8 != 0) && uVar9 != uVar28) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)&known,
                     (QLocaleId)((uint6)stack0xfffffffffffff87c << 0x20 | (uint6)(uint)id._0_4_));
        }
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(known.buffer + 0x18));
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    }
    pPVar24 = (PrivateShared *)((long)&pPVar24[-1].offset + 3);
    lVar27 = lVar27 + -6;
    lVar31 = local_7f0;
  }
  memcpy(&known,&DAT_0047fc50,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker(&known,(__return_storage_ptr__->d).size);
  __filename = (char *)0x0;
  while (pcVar18 = (char *)(__return_storage_ptr__->d).size, __filename < pcVar18) {
    bVar12 = QDuplicateTracker<QString,_32UL>::hasSeen
                       (&known,(__return_storage_ptr__->d).ptr + (long)__filename);
    if (bVar12) {
      QList<QString>::remove(__return_storage_ptr__,__filename);
    }
    else {
      __filename = __filename + 1;
    }
  }
  psVar33 = (storage_type_conflict *)&local_739;
  psVar29 = (storage_type_conflict *)0x0;
  local_808 = (storage_type_conflict *)0x0;
  psVar19 = (storage_type_conflict *)0x0;
  local_739 = separator;
  while ((long)psVar29 < (long)pcVar18) {
    pQVar22 = (__return_storage_ptr__->d).ptr;
    local_58.shared = (PrivateShared *)pQVar22[(long)psVar29].d.d;
    local_58._8_8_ = pQVar22[(long)psVar29].d.ptr;
    local_58._16_8_ = pQVar22[(long)psVar29].d.size;
    if (local_58.shared != (PrivateShared *)0x0) {
      LOCK();
      (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    name_00.m_data = psVar33;
    name_00.m_size = local_58._8_8_;
    QVar15 = QLocaleId::fromName((QLocaleId *)local_58._16_8_,name_00);
    local_738.d = (Data *)CONCAT26(local_738.d._6_2_,QVar15);
    QVar15 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_738);
    if ((long)psVar19 <= (long)psVar29) {
      lVar31 = (long)psVar29 * 0x18 + 0x28;
      psVar33 = psVar19;
      psVar19 = psVar29;
      while (psVar19 = (storage_type_conflict *)((long)psVar19 + 1), local_808 = psVar19,
            (long)psVar19 < (__return_storage_ptr__->d).size) {
        pQVar22 = (__return_storage_ptr__->d).ptr;
        name_01.m_data = psVar33;
        name_01.m_size = *(qsizetype *)((long)pQVar22 + lVar31 + -8);
        QVar26 = QLocaleId::fromName(*(QLocaleId **)((long)&(pQVar22->d).d + lVar31),name_01);
        local_738.d = (Data *)CONCAT26(local_738.d._6_2_,QVar26);
        QVar26 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_738);
        if (((QVar26.language_id != QVar15.language_id) ||
            (((QVar26._0_4_ ^ QVar15._0_4_) & 0xffff0000) != 0)) ||
           (lVar31 = lVar31 + 0x18, psVar33 = psVar19, QVar26.territory_id != QVar15.territory_id))
        break;
      }
    }
    local_758.d = (Data *)local_58.shared;
    local_758.ptr = (QString *)local_58._8_8_;
    local_758.size = local_58._16_8_;
    if (local_58.shared != (PrivateShared *)0x0) {
      LOCK();
      (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    this_00 = &local_758;
    stem.m_data = L"C";
    stem.m_size = 1;
    bVar12 = const::$_0::operator()(&local_739,(QString *)this_00,stem);
    if (bVar12) {
LAB_002e2c4f:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    }
    else {
      local_770.d = (Data *)local_58.shared;
      local_770.ptr = (char16_t *)local_58._8_8_;
      local_770.size = local_58._16_8_;
      if (local_58.shared != (PrivateShared *)0x0) {
        LOCK();
        (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      stem_00.m_data = L"und";
      stem_00.m_size = 3;
      bVar12 = const::$_0::operator()(&local_739,(QString *)&local_770,stem_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_770);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_758);
      if (!bVar12) {
        local_7e0 = (__return_storage_ptr__->d).size;
        local_738.d = (Data *)local_58.shared;
        local_738.ptr = (QString *)local_58._8_8_;
        local_738.size = local_58._16_8_;
        if (local_58.shared != (PrivateShared *)0x0) {
          LOCK();
          (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&(local_58.shared)->ref)->ref_)._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_7c0 = (long)local_808 * 0x18 + 0x28;
        local_7c8 = local_808;
LAB_002e2890:
        local_7c8 = (storage_type_conflict *)((long)local_7c8 + 1);
        do {
          c.ucs._1_1_ = 0;
          c.ucs._0_1_ = separator;
          qVar20 = QString::lastIndexOf((QString *)&local_738,c,CaseSensitive);
          if (qVar20 < 1) {
LAB_002e2c47:
            this_00 = &local_738;
            goto LAB_002e2c4f;
          }
          QString::QString((QString *)&id,(QChar *)local_738.ptr,qVar20);
          qVar20 = local_738.size;
          pQVar22 = local_738.ptr;
          pDVar10 = local_738.d;
          local_738.d = (Data *)_id;
          local_738.ptr = pQStack_780;
          _id = (PrivateShared *)pDVar10;
          pQStack_780 = pQVar22;
          local_738.size = (qsizetype)local_778;
          local_778 = (QLocaleId *)qVar20;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&id);
          bVar13 = QDuplicateTracker<QString,_32UL>::contains(&known,(QString *)&local_738);
          name_02.m_data = extraout_RDX_02;
          name_02.m_size = (qsizetype)local_738.ptr;
          QVar26 = QLocaleId::fromName((QLocaleId *)local_738.size,name_02);
          _id = (PrivateShared *)CONCAT26(uStack_782,QVar26);
          QVar26 = QLocaleId::withLikelySubtagsAdded(&id);
          bVar12 = ((QVar26._0_4_ ^ QVar15._0_4_) & 0xffff0000) == 0;
          local_818 = local_7c8;
          local_7d8 = local_7c0;
          psVar33 = local_808;
LAB_002e297d:
          if ((bVar13 == false) && ((long)psVar33 < local_7e0)) {
            pQVar22 = (__return_storage_ptr__->d).ptr;
            _id = (PrivateShared *)pQVar22[(long)psVar33].d.d;
            pQStack_780 = (QString *)pQVar22[(long)psVar33].d.ptr;
            local_778 = (QLocaleId *)pQVar22[(long)psVar33].d.size;
            if (_id != (PrivateShared *)0x0) {
              LOCK();
              (((QArrayData *)&_id->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&_id->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            bVar14 = QString::startsWith((QString *)&id,(QString *)&local_738,CaseSensitive);
            before.ucs._1_1_ = 0;
            before.ucs._0_1_ = separator;
            if (bVar14) {
              pQVar21 = local_778;
              pQVar22 = pQStack_780;
              if (*(char16_t *)((long)&(pQStack_780->d).d + local_738.size * 2) == c.ucs) {
                do {
                  local_7a8.ptr = (char *)pQVar22;
                  local_7a8.d = (Data *)pQVar21;
                  pQVar21 = (QLocaleId *)
                            QStringView::lastIndexOf((QStringView *)&local_7a8,before,CaseSensitive)
                  ;
                  if ((bVar13 != false) || ((long)pQVar21 <= local_738.size)) goto LAB_002e2ba4;
                  bVar12 = false;
                  lVar31 = local_7d8;
                  psVar32 = local_818;
                  local_7a8.d = (Data *)pQVar21;
                  while (pQVar21 = (QLocaleId *)local_7a8.d, pQVar22 = (QString *)local_7a8.ptr,
                        bVar12 == false) {
                    if ((__return_storage_ptr__->d).size <= (long)psVar32) {
                      bVar13 = true;
                      break;
                    }
                    pQVar22 = (__return_storage_ptr__->d).ptr;
                    local_6f8.m_data = *(storage_type_conflict **)((long)pQVar22 + lVar31 + -8);
                    local_6f8.m_size = *(undefined8 *)((long)&(pQVar22->d).d + lVar31);
                    bVar12 = ::comparesEqual(&local_6f8,(QStringView *)&local_7a8);
                    lVar31 = lVar31 + 0x18;
                    psVar32 = (storage_type_conflict *)((long)psVar32 + 1);
                  }
                } while( true );
              }
            }
            else {
              local_7a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_7a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_7a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
              pQVar22 = QString::replace((QString *)&id,before,(QChar)0x2d,CaseSensitive);
              name_03.m_data = extraout_RDX_03;
              name_03.m_size = (qsizetype)(pQVar22->d).ptr;
              QVar26 = QLocaleId::fromName((QLocaleId *)(pQVar22->d).size,name_03);
              local_7b0._0_4_ = QVar26._0_4_;
              local_7b0.territory_id = QVar26.territory_id;
              QVar26 = QLocaleId::withLikelySubtagsAdded(&local_7b0);
              local_6f8.m_size = CONCAT26(local_6f8.m_size._6_2_,QVar26);
              QLocaleId::name((QByteArray *)&local_7a8,(QLocaleId *)&local_6f8,separator);
              qVar20 = local_738.size;
              local_6f8.m_size = local_7a8.size;
              local_6f8.m_data = (storage_type_conflict *)local_7a8.ptr;
              s.m_data = (storage_type_conflict *)local_738.ptr;
              s.m_size = local_738.size;
              bVar14 = QLatin1String::startsWith((QLatin1String *)&local_6f8,s,CaseSensitive);
              if ((bVar14) &&
                 ((local_6f8.m_size == qVar20 ||
                  (*(TagSeparator *)((long)(ushort *)qVar20 + (long)(DataPointer *)local_6f8.m_data)
                   == local_739)))) {
                bVar12 = false;
              }
              QArrayDataPointer<char>::~QArrayDataPointer(&local_7a8);
            }
            goto LAB_002e2bb9;
          }
          if (bVar13 != false) goto LAB_002e2c47;
          QDuplicateTracker<QString,_32UL>::hasSeen(&known,(QString *)&local_738);
          if (bVar12) goto LAB_002e2c12;
          QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_738);
        } while( true );
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    psVar29 = (storage_type_conflict *)((long)psVar29 + 1);
    if ((long)psVar19 <= (long)psVar29) {
      psVar29 = local_808;
    }
    psVar33 = extraout_RDX_04;
    pcVar18 = (char *)(__return_storage_ptr__->d).size;
  }
  QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(&known);
  QArrayDataPointer<QLocaleId>::~QArrayDataPointer(&local_718);
LAB_002e2c95:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
LAB_002e2ba4:
  bVar12 = false;
LAB_002e2bb9:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&id);
  psVar33 = (storage_type_conflict *)((long)psVar33 + 1);
  local_7d8 = local_7d8 + 0x18;
  local_818 = (storage_type_conflict *)((long)local_818 + 1);
  goto LAB_002e297d;
LAB_002e2c12:
  QList<QString>::emplace<QString_const&>
            (__return_storage_ptr__,(qsizetype)local_808,(QString *)&local_738);
  local_808 = (storage_type_conflict *)((long)local_808 + 1);
  local_7e0 = local_7e0 + 1;
  local_7c0 = local_7c0 + 0x18;
  goto LAB_002e2890;
}

Assistant:

QStringList QLocale::uiLanguages(TagSeparator separator) const
{
    const char sep = char(separator);
    QStringList uiLanguages;
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("uiLanguages", sep);
        return uiLanguages;
    }
    QList<QLocaleId> localeIds;
#ifdef QT_NO_SYSTEMLOCALE
    constexpr bool isSystem = false;
#else
    const bool isSystem = d->m_data == &systemLocaleData;
    if (isSystem) {
        uiLanguages = systemLocale()->query(QSystemLocale::UILanguages).toStringList();
        if (separator != TagSeparator::Dash) {
            // Map from default separator, Dash, used by backends:
            const QChar join = QLatin1Char(sep);
            uiLanguages = uiLanguages.replaceInStrings(u"-", QStringView(&join, 1));
        }
        // ... but we need to include likely-adjusted forms of each of those, too.
        // For now, collect up locale Ids representing the entries, for later processing:
        for (const auto &entry : std::as_const(uiLanguages))
            localeIds.append(QLocaleId::fromName(entry));
        if (localeIds.isEmpty())
            localeIds.append(systemLocale()->fallbackLocale().d->m_data->id());
        // If the system locale (isn't C and) didn't include itself in the list,
        // or as fallback, presume to know better than it and put its name
        // first. (Known issue, QTBUG-104930, on some macOS versions when in
        // locale en_DE.) Our translation system might have a translation for a
        // locale the platform doesn't believe in.
        const QString name = QString::fromLatin1(d->m_data->id().name(sep)); // Raw name
        if (!name.isEmpty() && language() != C && !uiLanguages.contains(name)) {
            // That uses contains(name) as a cheap pre-test, but there may be an
            // entry that matches this on purging likely subtags.
            const QLocaleId id = d->m_data->id();
            const QLocaleId mine = id.withLikelySubtagsRemoved();
            const auto isMine = [mine](const QString &entry) {
                return QLocaleId::fromName(entry).withLikelySubtagsRemoved() == mine;
            };
            if (std::none_of(uiLanguages.constBegin(), uiLanguages.constEnd(), isMine)) {
                localeIds.prepend(id);
                uiLanguages.prepend(QString::fromLatin1(id.name(sep)));
            }
        }
    } else
#endif
    {
        localeIds.append(d->m_data->id());
    }

    for (qsizetype i = localeIds.size(); i-- > 0; ) {
        const QLocaleId id = localeIds.at(i);
        Q_ASSERT(id.language_id);
        if (id.language_id == C) {
            if (!uiLanguages.contains(u"C"_s))
                uiLanguages.append(u"C"_s);
            // Attempt no likely sub-tag amendments to C.
            continue;
        }

        qsizetype j;
        const QByteArray prior = id.name(sep);
        bool faithful = true; // prior matches uiLanguages.at(j - 1)
        if (isSystem && i < uiLanguages.size()) {
            // Adding likely-adjusted forms to system locale's list.
            faithful = uiLanguages.at(i) == QLatin1StringView(prior);
            Q_ASSERT(faithful
                     // A legacy code may get mapped to an ID with a different name:
                     || QLocaleId::fromName(uiLanguages.at(i)).name(sep) == prior);
            // Insert just after the entry we're supplementing:
            j = i + 1;
        } else {
            // Plain locale or empty system uiLanguages; just append.
            if (!uiLanguages.contains(QLatin1StringView(prior)))
                uiLanguages.append(QString::fromLatin1(prior));
            j = uiLanguages.size();
        }

        const QLocaleId max = id.withLikelySubtagsAdded();
        Q_ASSERT(max.language_id);
        Q_ASSERT(max.language_id == id.language_id);
        // We can't say the same for script or territory, though.

        // We have various candidates to consider.
        const auto addIfEquivalent = [&j, &uiLanguages, max, sep, prior, faithful](QLocaleId cid) {
            if (cid.withLikelySubtagsAdded() == max) {
                if (const QByteArray name = cid.name(sep); name != prior)
                    uiLanguages.insert(j, QString::fromLatin1(name));
                else if (faithful) // Later candidates are more specific, so go before.
                    --j;
            }
        };
        // language
        addIfEquivalent({ max.language_id, 0, 0 });
        // language-script
        if (max.script_id)
            addIfEquivalent({ max.language_id, max.script_id, 0 });
        if (id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, 0 });
        // language-territory
        if (max.territory_id)
            addIfEquivalent({ max.language_id, 0, max.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, 0, id.territory_id });
        // full
        if (max.territory_id && max.script_id)
            addIfEquivalent(max);
        if (max.territory_id && id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, max.territory_id });
        if (max.script_id && id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, max.script_id, id.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id
            && id.script_id && id.script_id != max.script_id) {
            addIfEquivalent(id);
        }
    }

    // Second pass: deduplicate.
    QDuplicateTracker<QString> known(uiLanguages.size());
    for (qsizetype i = 0; i < uiLanguages.size();) {
        if (known.hasSeen(uiLanguages.at(i)))
            uiLanguages.remove(i);
        else
            ++i;
    }

    // Third pass: add truncations, when not already present.
    // Cubic in list length, but hopefully that's at most a dozen or so.
    const QLatin1Char cut(sep);
    const auto hasPrefix = [cut](auto name, QStringView stem) {
        // A prefix only counts if it's either full or followed by a separator.
        return name.startsWith(stem)
            && (name.size() == stem.size() || name.at(stem.size()) == cut);
    };
    // As we now forward-traverse the list, we need to keep track of the
    // positions just after (a) the block of things added above that are
    // equivalent to the current entry and (b) the block of truncations (if any)
    // added just after this block. All truncations of entries in (a) belong at
    // the end of (b); once i advances to the end of (a) it must jump to just
    // after (b). The more specific entries in (a) may well have truncations
    // that can also arise from less specific ones later in (a); for the
    // purposes of determining whether such truncations go at the end of (b) or
    // the end of the list, we thus need to ignore these matches.
    qsizetype afterEquivs = 0;
    qsizetype afterTruncs = 0;
    // From here onwards, we only have the truncations we're adding, whose
    // truncations should all have been included already.
    // If advancing i brings us to the end of block (a), jump to the end of (b):
    for (qsizetype i = 0; i < uiLanguages.size(); ++i >= afterEquivs && (i = afterTruncs)) {
        const QString entry = uiLanguages.at(i);
        const QLocaleId max = QLocaleId::fromName(entry).withLikelySubtagsAdded();
        // Keep track of our two blocks:
        if (i >= afterEquivs) {
            Q_ASSERT(i >= afterTruncs); // i.e. we just skipped past the end of a block
            afterEquivs = i + 1;
            // Advance past equivalents of entry:
            while (afterEquivs < uiLanguages.size()
                   && QLocaleId::fromName(uiLanguages.at(afterEquivs))
                           .withLikelySubtagsAdded() == max) {
                ++afterEquivs;
            }
            // We'll add any truncations starting there:
            afterTruncs = afterEquivs;
        }
        if (hasPrefix(entry, u"C") || hasPrefix(entry, u"und"))
            continue;
        qsizetype stopAt = uiLanguages.size();
        QString prefix = entry;
        qsizetype at = 0;
        while ((at = prefix.lastIndexOf(cut)) > 0) {
            prefix = prefix.first(at);
            // Don't test with hasSeen() as we might defer adding to later, when
            // we'll need known to see the later entry's offering of this prefix
            // as a new entry.
            bool found = known.contains(prefix);
            /* By default we append but if no later entry has this as a prefix
               and the locale it implies would use the same script as entry, put
               it after the block of consecutive equivalents of which entry is a
               part instead. Thus [en-NL, nl-NL, en-GB] will append en but
               [en-NL, en-GB, nl-NL] will put it before nl-NL, for example. We
               require a script match so we don't pick translations that the
               user cannot read, despite knowing the language. (Ideally that
               would be a constraint the caller can opt into / out of. See
               QTBUG-112765.)
            */
            bool justAfter
                = (QLocaleId::fromName(prefix).withLikelySubtagsAdded().script_id == max.script_id);
            for (qsizetype j = afterTruncs; !found && j < stopAt; ++j) {
                QString later = uiLanguages.at(j);
                if (!later.startsWith(prefix)) {
                    const QByteArray laterFull =
                        QLocaleId::fromName(later.replace(cut, u'-')
                            ).withLikelySubtagsAdded().name(sep);
                    // When prefix matches a later entry's max, it belongs later.
                    if (hasPrefix(QLatin1StringView(laterFull), prefix))
                        justAfter = false;
                    continue;
                }
                // The duplicate tracker would already have spotted if equal:
                Q_ASSERT(later.size() > prefix.size());
                if (later.at(prefix.size()) == cut) {
                    justAfter = false;
                    // Prefix match. Shall produce the same prefix, but possibly
                    // after prefixes of other entries in the list. If later has
                    // a longer prefix not yet in the list, we want that before
                    // this shorter prefix, so leave this for later, otherwise,
                    // we include this prefix right away.
                    QStringView head{later};
                    for (qsizetype as = head.lastIndexOf(cut);
                         !found && as > prefix.size(); as = head.lastIndexOf(cut)) {
                        head = head.first(as);
                        bool seen = false;
                        for (qsizetype k = j + 1; !seen && k < uiLanguages.size(); ++k)
                            seen = uiLanguages.at(k) == head;
                        if (!seen)
                            found = true;
                    }
                }
            }
            if (found) // Don't duplicate.
                break; // any further truncations of prefix would also be found.
            // Now we're committed to adding it, get it into known:
            (void) known.hasSeen(prefix);
            if (justAfter) {
                uiLanguages.insert(afterTruncs++, prefix);
                ++stopAt; // All later entries have moved one step later.
            } else {
                uiLanguages.append(prefix);
            }
        }
    }

    return uiLanguages;
}